

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

pool_ptr<soul::AST::ASTObject> __thiscall
soul::SourceCodeUtilities::findASTObjectAt
          (SourceCodeUtilities *this,ASTObject *root,CodeLocation *targetLocation)

{
  undefined1 local_38 [8];
  FindLocationVisitor v;
  CodeLocation *targetLocation_local;
  ASTObject *root_local;
  
  v.result.object = (ASTObject *)targetLocation;
  findASTObjectAt::FindLocationVisitor::FindLocationVisitor((FindLocationVisitor *)local_38);
  v.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)UTF8Reader::getAddress(&targetLocation->location);
  findASTObjectAt(soul::AST::ASTObject&,soul::CodeLocation)::FindLocationVisitor::visitObject(soul::
  AST::ASTObject__((FindLocationVisitor *)local_38,root);
  *(char **)this = v.target;
  findASTObjectAt::FindLocationVisitor::~FindLocationVisitor((FindLocationVisitor *)local_38);
  return (pool_ptr<soul::AST::ASTObject>)(ASTObject *)this;
}

Assistant:

pool_ptr<AST::ASTObject> SourceCodeUtilities::findASTObjectAt (AST::ASTObject& root, CodeLocation targetLocation)
{
    struct FindLocationVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }

        const char* target = nullptr;
        pool_ptr<AST::ASTObject> result;
    };

    FindLocationVisitor v;
    v.target = targetLocation.location.getAddress();
    v.visitObject (root);
    return v.result;
}